

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.H
# Opt level: O0

void __thiscall String::String(String *this,char *s,bool nc)

{
  char *pcVar1;
  bool local_42;
  allocator local_41;
  string local_40;
  byte local_19;
  char *pcStack_18;
  bool nc_local;
  char *s_local;
  String *this_local;
  
  local_19 = nc;
  pcStack_18 = s;
  s_local = (char *)this;
  std::__cxx11::string::string((string *)this);
  pcVar1 = pcStack_18;
  this->_noCase = (bool)(local_19 & 1);
  this->_no = false;
  this->_list = false;
  local_42 = pcStack_18 == (char *)0x0;
  if (local_42) {
    std::__cxx11::string::string((string *)&local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  }
  local_42 = !local_42;
  setValue(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_42) {
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return;
}

Assistant:

inline String(char const * s, bool nc = false)
        : _noCase(nc)
        , _no(false)
        , _list(false)
    {
        setValue(s != nullptr ? std::string(s) : std::string());
    }